

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

bool testExtendAndPrepend<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  bool bVar4;
  char *__assertion;
  _Alloc_hider _Var5;
  string input;
  string base;
  string prepend;
  string extend;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&hf,4,L);
  std::__cxx11::string::string((string *)&input,"XABCDY",(allocator *)&base);
  base._M_dataplus._M_p = (pointer)&base.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&base,input._M_dataplus._M_p + 1,
             input._M_dataplus._M_p + (input._M_string_length - 1));
  if (base._M_string_length != 4) {
    __assertion = "base.size() == n";
    uVar2 = 0x11;
    goto LAB_001038a2;
  }
  extend._M_dataplus._M_p = (pointer)&extend.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&extend,input._M_dataplus._M_p + 1,
             input._M_dataplus._M_p + input._M_string_length);
  prepend._M_dataplus._M_p = (pointer)&prepend.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&prepend,input._M_dataplus._M_p,
             input._M_dataplus._M_p + (input._M_string_length - 1));
  for (_Var5 = base._M_dataplus; uVar2 = hf.hashvalue,
      _Var5._M_p != base._M_dataplus._M_p + base._M_string_length; _Var5._M_p = _Var5._M_p + 1) {
    CyclicHash<unsigned_int,_unsigned_char>::eat(&hf,*_Var5._M_p);
  }
  uVar1 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                    ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&base);
  if (uVar2 == uVar1) {
    uVar2 = CyclicHash<unsigned_int,_unsigned_char>::hash_prepend(&hf,*input._M_dataplus._M_p);
    uVar1 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                      ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&prepend);
    if (uVar2 == uVar1) {
      uVar2 = CyclicHash<unsigned_int,_unsigned_char>::hash_extend
                        (&hf,input._M_dataplus._M_p[input._M_string_length - 1]);
      uVar1 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                        ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&extend);
      if (uVar2 == uVar1) {
        uVar2 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&base);
        if (hf.hashvalue != uVar2) {
          __assertion = "hf.hashvalue == hf.hash(base)";
          uVar2 = 0x2a;
LAB_001038a2:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,uVar2,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        uVar2 = CyclicHash<unsigned_int,_unsigned_char>::hash_prepend(&hf,*input._M_dataplus._M_p);
        uVar1 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&prepend);
        if (uVar2 != uVar1) {
          __assertion = "hf.hash_prepend(input[0]) == hf.hash(prepend)";
          uVar2 = 0x2b;
          goto LAB_001038a2;
        }
        uVar2 = CyclicHash<unsigned_int,_unsigned_char>::hash_extend
                          (&hf,input._M_dataplus._M_p[input._M_string_length - 1]);
        uVar1 = CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                          ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&extend);
        bVar4 = true;
        if (uVar2 != uVar1) {
          __assertion = "hf.hash_extend(input.back()) == hf.hash(extend)";
          uVar2 = 0x2c;
          goto LAB_001038a2;
        }
        goto LAB_00103855;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"bug!");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&extend);
      poVar3 = std::operator<<(poVar3," ");
      CyclicHash<unsigned_int,_unsigned_char>::hash_extend
                (&hf,input._M_dataplus._M_p[input._M_string_length - 1]);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ");
      CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&extend);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"bug!");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&prepend);
      poVar3 = std::operator<<(poVar3," ");
      CyclicHash<unsigned_int,_unsigned_char>::hash_prepend(&hf,*input._M_dataplus._M_p);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ");
      CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
                ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&prepend);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"bug!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&base);
    poVar3 = std::operator<<(poVar3," ");
    CyclicHash<unsigned_int,unsigned_char>::hash<std::__cxx11::string>
              ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&base);
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  bVar4 = false;
LAB_00103855:
  std::__cxx11::string::~string((string *)&prepend);
  std::__cxx11::string::~string((string *)&extend);
  std::__cxx11::string::~string((string *)&base);
  std::__cxx11::string::~string((string *)&input);
  return bVar4;
}

Assistant:

bool testExtendAndPrepend(uint L = 19) {
  const uint n(4); // n-grams
  hashfunction hf(n, L);
  string input = "XABCDY";
  string base(input.begin() + 1, input.end() - 1);
  assert(base.size() == n);
  string extend(input.begin() + 1, input.end());
  string prepend(input.begin(), input.end() - 1);

  for (string::const_iterator j = base.begin(); j != base.end(); ++j) {
    hf.eat(*j);
  }
  if (hf.hashvalue != hf.hash(base)) {
    std::cout << "bug!" << std::endl;
    std::cout << base << " " << hf.hash(base) << std::endl;
    return false;
  }
  if (hf.hash_prepend(input[0]) != hf.hash(prepend)) {
    std::cout << "bug!" << std::endl;
    std::cout << prepend << " " << hf.hash_prepend(input[0]) << " "
              << hf.hash(prepend) << std::endl;
    return false;
  }
  if (hf.hash_extend(input.back()) != hf.hash(extend)) {
    std::cout << "bug!" << std::endl;
    std::cout << extend << " " << hf.hash_extend(input.back()) << " "
              << hf.hash(extend) << std::endl;
    return false;
  }

  assert(hf.hashvalue == hf.hash(base));
  assert(hf.hash_prepend(input[0]) == hf.hash(prepend));
  assert(hf.hash_extend(input.back()) == hf.hash(extend));

  return true;
}